

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtrAbc.c
# Opt level: O1

Bac_Man_t * Bac_PtrTransformToCba(Vec_Ptr_t *vDes)

{
  Vec_Ptr_t *vNtk;
  void **ppvVar1;
  bool bVar2;
  int NameId;
  int iVar3;
  int iVar4;
  Bac_Man_t *pBVar5;
  char *pcVar6;
  size_t sVar7;
  Abc_Nam_t *pAVar8;
  Bac_Ntk_t *pBVar9;
  Vec_Int_t *vMap;
  int *piVar10;
  Vec_Int_t *vBox2Id;
  void *pvVar11;
  char *pcVar12;
  int iVar13;
  size_t __nmemb;
  long lVar14;
  long lVar15;
  long lVar16;
  int local_4c;
  Bac_Man_t *local_48;
  long local_40;
  void *local_38;
  
  iVar4 = vDes->nSize;
  __nmemb = (size_t)iVar4;
  if ((long)__nmemb < 1) {
LAB_00394270:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  pcVar12 = (char *)*vDes->pArray;
  pBVar5 = (Bac_Man_t *)calloc(1,0x530);
  pcVar6 = Extra_FileDesignName(pcVar12);
  pBVar5->pName = pcVar6;
  local_48 = pBVar5;
  if (pcVar12 == (char *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar12);
    pcVar6 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar6,pcVar12);
  }
  pBVar5 = local_48;
  local_48->pSpec = pcVar6;
  pAVar8 = Abc_NamStart(1000,0x18);
  pBVar5->pStrs = pAVar8;
  pAVar8 = Abc_NamStart(1000,0x18);
  pBVar5->pMods = pAVar8;
  pBVar5->iRoot = 1;
  pBVar5->nNtks = iVar4 + -1;
  pBVar9 = (Bac_Ntk_t *)calloc(__nmemb,0xd0);
  pBVar5->pNtks = pBVar9;
  if (iVar4 != 1) {
    lVar14 = __nmemb - 1;
    do {
      pBVar9 = pBVar9 + 1;
      pBVar9->pDesign = pBVar5;
      lVar14 = lVar14 + -1;
    } while (lVar14 != 0);
  }
  Bac_ManSetupTypes(pBVar5->pPrimNames,pBVar5->pPrimSymbs);
  vMap = (Vec_Int_t *)malloc(0x10);
  vMap->nCap = 1000;
  vMap->nSize = 0;
  piVar10 = (int *)malloc(4000);
  vMap->pArray = piVar10;
  vMap->nSize = 1000;
  if (piVar10 != (int *)0x0) {
    memset(piVar10,0xff,4000);
  }
  vBox2Id = (Vec_Int_t *)malloc(0x10);
  vBox2Id->nCap = 1000;
  vBox2Id->nSize = 0;
  piVar10 = (int *)malloc(4000);
  vBox2Id->pArray = piVar10;
  if (0 < pBVar5->nNtks) {
    lVar14 = 1;
    lVar15 = 0xd0;
    do {
      if (vDes->nSize <= lVar14) goto LAB_00394270;
      vNtk = (Vec_Ptr_t *)vDes->pArray[lVar14];
      if ((vNtk->nSize < 2) || (local_40 = lVar14, vNtk->nSize == 2)) goto LAB_00394270;
      pBVar9 = pBVar5->pNtks;
      ppvVar1 = vNtk->pArray;
      pvVar11 = ppvVar1[1];
      local_38 = ppvVar1[2];
      NameId = Abc_NamStrFindOrAdd(pBVar5->pStrs,(char *)*ppvVar1,(int *)0x0);
      iVar4 = *(int *)((long)pvVar11 + 4);
      iVar13 = *(int *)((long)local_38 + 4);
      iVar3 = Ptr_ManCountNtk(vNtk);
      if (*(long *)((long)&pBVar9->pDesign + lVar15) == 0) {
        __assert_fail("pNew->pDesign != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                      ,0x218,"void Bac_NtkAlloc(Bac_Ntk_t *, int, int, int, int)");
      }
      if (*(int *)((long)&(pBVar9->vInputs).nSize + lVar15) != 0) {
        __assert_fail("Bac_NtkPiNum(pNew) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                      ,0x219,"void Bac_NtkAlloc(Bac_Ntk_t *, int, int, int, int)");
      }
      if (*(int *)((long)&(pBVar9->vOutputs).nSize + lVar15) != 0) {
        __assert_fail("Bac_NtkPoNum(pNew) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                      ,0x21a,"void Bac_NtkAlloc(Bac_Ntk_t *, int, int, int, int)");
      }
      *(int *)((long)&pBVar9->NameId + lVar15) = NameId;
      *(undefined8 *)((long)&pBVar9->iCopy + lVar15) = 0xffffffffffffffff;
      *(undefined4 *)((long)&pBVar9->iBoxObj + lVar15) = 0xffffffff;
      if (*(int *)((long)&(pBVar9->vInputs).nCap + lVar15) < iVar4) {
        pvVar11 = *(void **)((long)&(pBVar9->vInputs).pArray + lVar15);
        if (pvVar11 == (void *)0x0) {
          pvVar11 = malloc((long)iVar4 << 2);
        }
        else {
          pvVar11 = realloc(pvVar11,(long)iVar4 << 2);
        }
        *(void **)((long)&(pBVar9->vInputs).pArray + lVar15) = pvVar11;
        if (pvVar11 == (void *)0x0) goto LAB_0039428f;
        *(int *)((long)&(pBVar9->vInputs).nCap + lVar15) = iVar4;
      }
      pBVar5 = local_48;
      if (*(int *)((long)&(pBVar9->vOutputs).nCap + lVar15) < iVar13) {
        pvVar11 = *(void **)((long)&(pBVar9->vOutputs).pArray + lVar15);
        if (pvVar11 == (void *)0x0) {
          pvVar11 = malloc((long)iVar13 << 2);
        }
        else {
          pvVar11 = realloc(pvVar11,(long)iVar13 << 2);
        }
        *(void **)((long)&(pBVar9->vOutputs).pArray + lVar15) = pvVar11;
        if (pvVar11 == (void *)0x0) goto LAB_0039428f;
        *(int *)((long)&(pBVar9->vOutputs).nCap + lVar15) = iVar13;
      }
      if (*(int *)((long)&(pBVar9->vType).nCap + lVar15) < iVar3) {
        pvVar11 = *(void **)((long)&(pBVar9->vType).pArray + lVar15);
        if (pvVar11 == (void *)0x0) {
          pvVar11 = malloc((long)iVar3);
        }
        else {
          pvVar11 = realloc(pvVar11,(long)iVar3);
        }
        *(void **)((long)&(pBVar9->vType).pArray + lVar15) = pvVar11;
        *(int *)((long)&(pBVar9->vType).nCap + lVar15) = iVar3;
      }
      if (*(int *)((long)&(pBVar9->vFanin).nCap + lVar15) < iVar3) {
        pvVar11 = *(void **)((long)&(pBVar9->vFanin).pArray + lVar15);
        if (pvVar11 == (void *)0x0) {
          pvVar11 = malloc((long)iVar3 << 2);
        }
        else {
          pvVar11 = realloc(pvVar11,(long)iVar3 << 2);
        }
        *(void **)((long)&(pBVar9->vFanin).pArray + lVar15) = pvVar11;
        if (pvVar11 == (void *)0x0) goto LAB_0039428f;
        *(int *)((long)&(pBVar9->vFanin).nCap + lVar15) = iVar3;
      }
      lVar14 = *(long *)((long)&pBVar9->pDesign + lVar15);
      pAVar8 = *(Abc_Nam_t **)(lVar14 + 0x18);
      pcVar12 = Abc_NamStr(*(Abc_Nam_t **)(lVar14 + 0x10),NameId);
      iVar4 = Abc_NamStrFindOrAdd(pAVar8,pcVar12,&local_4c);
      lVar14 = *(long *)((long)&pBVar9->pDesign + lVar15);
      if (local_4c == 0) {
        iVar13 = (int)((ulong)((long)pBVar9 + (lVar15 - *(long *)(lVar14 + 0x28))) >> 4) *
                 -0x3b13b13b;
        if ((iVar13 < 1) || (*(int *)(lVar14 + 0x24) < iVar13)) {
          __assert_fail("Bac_ManNtkIsOk(p->pDesign, i)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                        ,0xd2,"int Bac_NtkId(Bac_Ntk_t *)");
        }
        if (iVar4 != iVar13) {
          __assert_fail("NtkId == Bac_NtkId(pNew)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                        ,0x228,"void Bac_NtkAlloc(Bac_Ntk_t *, int, int, int, int)");
        }
      }
      else {
        Abc_NamStr(*(Abc_Nam_t **)(lVar14 + 0x10),NameId);
        printf("Network with name %s already exists.\n");
      }
      iVar4 = *(int *)((long)&(pBVar9->vType).nCap + lVar15);
      lVar14 = (long)iVar4;
      if (lVar14 == 0) {
        __assert_fail("Bac_NtkObjNumAlloc(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                      ,0xfc,"void Bac_NtkStartNames(Bac_Ntk_t *)");
      }
      if (*(int *)((long)&(pBVar9->vName).nCap + lVar15) < iVar4) {
        pvVar11 = *(void **)((long)&(pBVar9->vName).pArray + lVar15);
        if (pvVar11 == (void *)0x0) {
          pvVar11 = malloc(lVar14 * 4);
        }
        else {
          pvVar11 = realloc(pvVar11,lVar14 * 4);
        }
        *(void **)((long)&(pBVar9->vName).pArray + lVar15) = pvVar11;
        if (pvVar11 == (void *)0x0) {
LAB_0039428f:
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x215,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        *(int *)((long)&(pBVar9->vName).nCap + lVar15) = iVar4;
      }
      if (0 < iVar4) {
        memset(*(void **)((long)&(pBVar9->vName).pArray + lVar15),0,lVar14 << 2);
      }
      *(int *)((long)&(pBVar9->vName).nSize + lVar15) = iVar4;
      lVar14 = local_40 + 1;
      lVar15 = lVar15 + 0xd0;
    } while (local_40 < pBVar5->nNtks);
  }
  if (pBVar5->nNtks < 1) {
    lVar14 = 1;
  }
  else {
    lVar16 = 0xd0;
    lVar15 = 1;
    do {
      if (vDes->nSize <= lVar15) goto LAB_00394270;
      iVar4 = Bac_NtkDeriveFromPtr
                        ((Bac_Ntk_t *)((long)&pBVar5->pNtks->pDesign + lVar16),
                         (Vec_Ptr_t *)vDes->pArray[lVar15],vMap,vBox2Id);
      lVar14 = lVar15;
      if (iVar4 == 0) break;
      lVar14 = lVar15 + 1;
      lVar16 = lVar16 + 0xd0;
      bVar2 = lVar15 < pBVar5->nNtks;
      lVar15 = lVar14;
    } while (bVar2);
  }
  if ((int)lVar14 <= pBVar5->nNtks) {
    if (0 < pBVar5->nNtks) {
      lVar14 = 0x198;
      lVar15 = 0;
      do {
        pBVar9 = pBVar5->pNtks;
        pvVar11 = *(void **)((long)pBVar9 + lVar14 + -0xa0);
        if (pvVar11 != (void *)0x0) {
          free(pvVar11);
          *(undefined8 *)((long)pBVar9 + lVar14 + -0xa0) = 0;
        }
        *(undefined8 *)((long)pBVar9 + lVar14 + -0xa8) = 0;
        pvVar11 = *(void **)((long)pBVar9 + lVar14 + -0x90);
        if (pvVar11 != (void *)0x0) {
          free(pvVar11);
          *(undefined8 *)((long)pBVar9 + lVar14 + -0x90) = 0;
        }
        *(undefined8 *)((long)pBVar9 + lVar14 + -0x98) = 0;
        pvVar11 = *(void **)((long)pBVar9 + lVar14 + -0x80);
        if (pvVar11 != (void *)0x0) {
          free(pvVar11);
          *(undefined8 *)((long)pBVar9 + lVar14 + -0x80) = 0;
        }
        *(undefined8 *)((long)pBVar9 + lVar14 + -0x88) = 0;
        pvVar11 = *(void **)((long)pBVar9 + lVar14 + -0x70);
        if (pvVar11 != (void *)0x0) {
          free(pvVar11);
          *(undefined8 *)((long)pBVar9 + lVar14 + -0x70) = 0;
        }
        *(undefined8 *)((long)pBVar9 + lVar14 + -0x78) = 0;
        pvVar11 = *(void **)((long)pBVar9 + lVar14 + -0x60);
        if (pvVar11 != (void *)0x0) {
          free(pvVar11);
          *(undefined8 *)((long)pBVar9 + lVar14 + -0x60) = 0;
        }
        *(undefined8 *)((long)pBVar9 + lVar14 + -0x68) = 0;
        pvVar11 = *(void **)((long)pBVar9 + lVar14 + -0x50);
        if (pvVar11 != (void *)0x0) {
          free(pvVar11);
          *(undefined8 *)((long)pBVar9 + lVar14 + -0x50) = 0;
        }
        *(undefined8 *)((long)pBVar9 + lVar14 + -0x58) = 0;
        pvVar11 = *(void **)((long)pBVar9 + lVar14 + -0x40);
        if (pvVar11 != (void *)0x0) {
          free(pvVar11);
          *(undefined8 *)((long)pBVar9 + lVar14 + -0x40) = 0;
        }
        *(undefined8 *)((long)pBVar9 + lVar14 + -0x48) = 0;
        pvVar11 = *(void **)((long)pBVar9 + lVar14 + -0x30);
        if (pvVar11 != (void *)0x0) {
          free(pvVar11);
          *(undefined8 *)((long)pBVar9 + lVar14 + -0x30) = 0;
        }
        *(undefined8 *)((long)pBVar9 + lVar14 + -0x38) = 0;
        pvVar11 = *(void **)((long)pBVar9 + lVar14 + -0x20);
        if (pvVar11 != (void *)0x0) {
          free(pvVar11);
          *(undefined8 *)((long)pBVar9 + lVar14 + -0x20) = 0;
        }
        *(undefined8 *)((long)pBVar9 + lVar14 + -0x28) = 0;
        pvVar11 = *(void **)((long)pBVar9 + lVar14 + -0x10);
        if (pvVar11 != (void *)0x0) {
          free(pvVar11);
          *(undefined8 *)((long)pBVar9 + lVar14 + -0x10) = 0;
        }
        *(undefined8 *)((long)pBVar9 + lVar14 + -0x18) = 0;
        pvVar11 = *(void **)((long)&pBVar9->pDesign + lVar14);
        if (pvVar11 != (void *)0x0) {
          free(pvVar11);
          *(undefined8 *)((long)&pBVar9->pDesign + lVar14) = 0;
        }
        *(undefined8 *)((long)pBVar9 + lVar14 + -8) = 0;
        lVar15 = lVar15 + 1;
        lVar14 = lVar14 + 0xd0;
      } while (lVar15 < pBVar5->nNtks);
    }
    piVar10 = (pBVar5->vBuf2LeafNtk).pArray;
    if (piVar10 != (int *)0x0) {
      free(piVar10);
      (pBVar5->vBuf2LeafNtk).pArray = (int *)0x0;
    }
    (pBVar5->vBuf2LeafNtk).nCap = 0;
    (pBVar5->vBuf2LeafNtk).nSize = 0;
    piVar10 = (pBVar5->vBuf2LeafObj).pArray;
    if (piVar10 != (int *)0x0) {
      free(piVar10);
      (pBVar5->vBuf2LeafObj).pArray = (int *)0x0;
    }
    (pBVar5->vBuf2LeafObj).nCap = 0;
    (pBVar5->vBuf2LeafObj).nSize = 0;
    piVar10 = (pBVar5->vBuf2RootNtk).pArray;
    if (piVar10 != (int *)0x0) {
      free(piVar10);
      (pBVar5->vBuf2RootNtk).pArray = (int *)0x0;
    }
    (pBVar5->vBuf2RootNtk).nCap = 0;
    (pBVar5->vBuf2RootNtk).nSize = 0;
    piVar10 = (pBVar5->vBuf2RootObj).pArray;
    if (piVar10 != (int *)0x0) {
      free(piVar10);
      (pBVar5->vBuf2RootObj).pArray = (int *)0x0;
    }
    (pBVar5->vBuf2RootObj).nCap = 0;
    (pBVar5->vBuf2RootObj).nSize = 0;
    Abc_NamDeref(pBVar5->pStrs);
    Abc_NamDeref(pBVar5->pMods);
    if (pBVar5->pName != (char *)0x0) {
      free(pBVar5->pName);
      pBVar5->pName = (char *)0x0;
    }
    if (pBVar5->pSpec != (char *)0x0) {
      free(pBVar5->pSpec);
      pBVar5->pSpec = (char *)0x0;
    }
    if (pBVar5->pNtks != (Bac_Ntk_t *)0x0) {
      free(pBVar5->pNtks);
      pBVar5->pNtks = (Bac_Ntk_t *)0x0;
    }
    free(pBVar5);
    pBVar5 = (Bac_Man_t *)0x0;
  }
  if (vBox2Id->pArray != (int *)0x0) {
    free(vBox2Id->pArray);
    vBox2Id->pArray = (int *)0x0;
  }
  free(vBox2Id);
  if (vMap->pArray != (int *)0x0) {
    free(vMap->pArray);
    vMap->pArray = (int *)0x0;
  }
  free(vMap);
  return pBVar5;
}

Assistant:

Bac_Man_t * Bac_PtrTransformToCba( Vec_Ptr_t * vDes )
{
    char * pName = (char *)Vec_PtrEntry(vDes, 0);
    Bac_Man_t * pNew = Bac_ManAlloc( pName, Vec_PtrSize(vDes) - 1 );
    Vec_Int_t * vMap = Vec_IntStartFull( 1000 );
    Vec_Int_t * vBox2Id = Vec_IntAlloc( 1000 );
    // create interfaces
    Bac_Ntk_t * pNtk; int i;
    Bac_ManForEachNtk( pNew, pNtk, i )
    {
        Vec_Ptr_t * vNtk = (Vec_Ptr_t *)Vec_PtrEntry(vDes, i);
        Vec_Ptr_t * vInputs = (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 1);
        Vec_Ptr_t * vOutputs = (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 2);
        int NameId = Abc_NamStrFindOrAdd( pNew->pStrs, (char *)Vec_PtrEntry(vNtk, 0), NULL );
        Bac_NtkAlloc( pNtk, NameId, Vec_PtrSize(vInputs), Vec_PtrSize(vOutputs), Ptr_ManCountNtk(vNtk) );
        Bac_NtkStartNames( pNtk );
    }
    // parse the networks
    Bac_ManForEachNtk( pNew, pNtk, i )
    {
        Vec_Ptr_t * vNtk = (Vec_Ptr_t *)Vec_PtrEntry(vDes, i);
        if ( !Bac_NtkDeriveFromPtr( pNtk, vNtk, vMap, vBox2Id ) )
            break;
    }
    if ( i <= Bac_ManNtkNum(pNew) )
       Bac_ManFree(pNew), pNew = NULL;
    Vec_IntFree( vBox2Id );
    Vec_IntFree( vMap );
    return pNew;
}